

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::BaseCompiler::newVirtReg
          (BaseCompiler *this,VirtReg **out,TypeId typeId,OperandSignature signature,char *name)

{
  VirtReg VVar1;
  uint uVar2;
  Error EVar3;
  VirtReg VVar4;
  Error EStack_50;
  VirtReg *local_38;
  
  *out = (VirtReg *)0x0;
  uVar2 = *(uint *)&this->field_0x1f0;
  if (uVar2 < 0xfffffeff) {
    EVar3 = ZoneVector<asmjit::v1_14::VirtReg_*>::willGrow
                      (&this->_vRegArray,&(this->super_BaseBuilder)._allocator,1);
    if (EVar3 == 0) {
      local_38 = (VirtReg *)Zone::allocZeroed(&this->_vRegZone,0x30,8);
      if (local_38 != (VirtReg *)0x0) {
        VVar1 = *(VirtReg *)(TypeUtils::_typeData + (ulong)typeId + 0x100);
        VVar4 = (VirtReg)0x40;
        if ((byte)VVar1 < 0x40) {
          VVar4 = VVar1;
        }
        *(uint32_t *)local_38 = signature._bits;
        *(uint *)(local_38 + 4) = uVar2 + 0x100;
        *(uint *)(local_38 + 8) = (uint)(byte)VVar1;
        local_38[0xc] = VVar4;
        local_38[0xd] = (VirtReg)typeId;
        local_38[0xe] = (VirtReg)0x1;
        *(undefined8 *)(local_38 + 0xf) = 0;
        *(undefined8 *)(local_38 + 0x17) = 0;
        *(undefined8 *)(local_38 + 0x1f) = 0;
        *(undefined8 *)(local_38 + 0x27) = 0;
        local_38[0x2f] = (VirtReg)0x0;
        if ((name == (char *)0x0) || (*name == '\0')) {
          BaseCompiler_assignGenericName(this,local_38);
        }
        else {
          ZoneStringBase::setData
                    ((ZoneStringBase *)(local_38 + 0x18),&(this->super_BaseBuilder)._dataZone,0xb,
                     name,0xffffffffffffffff);
        }
        ZoneVector<asmjit::v1_14::VirtReg_*>::appendUnsafe(&this->_vRegArray,&local_38);
        *out = local_38;
        return 0;
      }
    }
    EStack_50 = 1;
  }
  else {
    EStack_50 = 0x3f;
  }
  EVar3 = BaseEmitter::reportError((BaseEmitter *)this,EStack_50,(char *)0x0);
  return EVar3;
}

Assistant:

Error BaseCompiler::newVirtReg(VirtReg** out, TypeId typeId, OperandSignature signature, const char* name) {
  *out = nullptr;
  uint32_t index = _vRegArray.size();

  if (ASMJIT_UNLIKELY(index >= uint32_t(Operand::kVirtIdCount)))
    return reportError(DebugUtils::errored(kErrorTooManyVirtRegs));

  if (ASMJIT_UNLIKELY(_vRegArray.willGrow(&_allocator) != kErrorOk))
    return reportError(DebugUtils::errored(kErrorOutOfMemory));

  VirtReg* vReg = _vRegZone.allocZeroedT<VirtReg>();
  if (ASMJIT_UNLIKELY(!vReg))
    return reportError(DebugUtils::errored(kErrorOutOfMemory));

  uint32_t size = TypeUtils::sizeOf(typeId);
  uint32_t alignment = Support::min<uint32_t>(size, 64);

  vReg = new(Support::PlacementNew{vReg}) VirtReg(signature, Operand::indexToVirtId(index), size, alignment, typeId);

#ifndef ASMJIT_NO_LOGGING
  if (name && name[0] != '\0')
    vReg->_name.setData(&_dataZone, name, SIZE_MAX);
  else
    BaseCompiler_assignGenericName(this, vReg);
#else
  DebugUtils::unused(name);
#endif

  _vRegArray.appendUnsafe(vReg);
  *out = vReg;

  return kErrorOk;
}